

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::application_specific_pool::_legacy_pool_policy::application_requested
          (_legacy_pool_policy *this,service *srv)

{
  application *paVar1;
  reference ppaVar2;
  long in_RDI;
  service *in_stack_ffffffffffffffd8;
  _policy *in_stack_ffffffffffffffe0;
  
  if ((*(ulong *)(in_RDI + 0x30) < *(ulong *)(in_RDI + 0x48)) &&
     (*(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1,
     *(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x38))) {
    paVar1 = _policy::get_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    ppaVar2 = std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::operator[]
                        ((vector<cppcms::application_*,_std::allocator<cppcms::application_*>_> *)
                         (in_RDI + 0x18),*(size_type *)(in_RDI + 0x40));
    *ppaVar2 = paVar1;
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  }
  return;
}

Assistant:

virtual void application_requested(cppcms::service &srv) 
	{
		if(total_ >= limit_)
			return;
		pending_++;
		if(pending_ > size_) {
			apps_[size_] = get_new(srv);
			size_++;
			total_++;
		}
	}